

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionManager.cpp
# Opt level: O2

void __thiscall OpenMD::SelectionManager::SelectionManager(SelectionManager *this,SimInfo *info)

{
  vector<int,_std::allocator<int>_> *this_00;
  vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *this_01;
  Molecule *pMVar1;
  pointer ppAVar2;
  pointer ppRVar3;
  pointer ppBVar4;
  pointer ppBVar5;
  pointer ppTVar6;
  pointer ppIVar7;
  Atom *pAVar8;
  RigidBody *pRVar9;
  Bond *pBVar10;
  Bend *pBVar11;
  Torsion *pTVar12;
  Inversion *pIVar13;
  MoleculeIterator mi;
  MoleculeIterator local_60;
  vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_> *local_58;
  SelectionSet *local_50;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  this->info_ = info;
  local_50 = &this->ss_;
  SelectionSet::SelectionSet(local_50);
  this_00 = &this->nObjects_;
  this_01 = &this->stuntdoubles_;
  local_58 = &this->molecules_;
  memset(this_00,0,0xa8);
  local_60._M_node._0_4_ = this->info_->nGlobalRigidBodies_ + this->info_->nGlobalAtoms_;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,(int *)&local_60);
  local_60._M_node._0_4_ = this->info_->nGlobalBonds_;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,(int *)&local_60);
  local_60._M_node._0_4_ = this->info_->nGlobalBends_;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,(int *)&local_60);
  local_60._M_node._0_4_ = this->info_->nGlobalTorsions_;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,(int *)&local_60);
  local_60._M_node._0_4_ = this->info_->nGlobalInversions_;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,(int *)&local_60);
  local_60._M_node._0_4_ = this->info_->nGlobalMols_;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,(int *)&local_60);
  std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::resize
            (this_01,(long)*(this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start);
  std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>::resize
            (&this->bonds_,
             (long)(this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start[1]);
  std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>::resize
            (&this->bends_,
             (long)(this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start[2]);
  std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>::resize
            (&this->torsions_,
             (long)(this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start[3]);
  std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>::resize
            (&this->inversions_,
             (long)(this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start[4]);
  std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>::resize
            (local_58,(long)(this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start[5]);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_48,this_00);
  SelectionSet::resize(local_50,(vector<int,_std::allocator<int>_> *)&local_48);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  local_60._M_node = (_Base_ptr)0x0;
  pMVar1 = SimInfo::beginMolecule(this->info_,&local_60);
  while (pMVar1 != (Molecule *)0x0) {
    (local_58->super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>)._M_impl.
    super__Vector_impl_data._M_start[pMVar1->globalIndex_] = pMVar1;
    ppAVar2 = (pMVar1->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppAVar2 !=
        (pMVar1->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl
        .super__Vector_impl_data._M_finish) goto LAB_001526b2;
    pAVar8 = (Atom *)0x0;
    while (pAVar8 != (Atom *)0x0) {
      (this_01->super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>).
      _M_impl.super__Vector_impl_data._M_start[(pAVar8->super_StuntDouble).globalIndex_] =
           &pAVar8->super_StuntDouble;
      ppAVar2 = ppAVar2 + 1;
      pAVar8 = (Atom *)0x0;
      if (ppAVar2 !=
          (pMVar1->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
LAB_001526b2:
        pAVar8 = *ppAVar2;
      }
    }
    ppRVar3 = (pMVar1->rigidBodies_).
              super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (ppRVar3 !=
        (pMVar1->rigidBodies_).
        super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_001526eb;
    pRVar9 = (RigidBody *)0x0;
    while (pRVar9 != (RigidBody *)0x0) {
      (this_01->super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>).
      _M_impl.super__Vector_impl_data._M_start[(pRVar9->super_StuntDouble).globalIndex_] =
           &pRVar9->super_StuntDouble;
      ppRVar3 = ppRVar3 + 1;
      pRVar9 = (RigidBody *)0x0;
      if (ppRVar3 !=
          (pMVar1->rigidBodies_).
          super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
LAB_001526eb:
        pRVar9 = *ppRVar3;
      }
    }
    ppBVar4 = (pMVar1->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppBVar4 !=
        (pMVar1->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl
        .super__Vector_impl_data._M_finish) goto LAB_0015271c;
    pBVar10 = (Bond *)0x0;
    while (pBVar10 != (Bond *)0x0) {
      (this->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
      super__Vector_impl_data._M_start[(pBVar10->super_ShortRangeInteraction).globalIndex_] =
           pBVar10;
      ppBVar4 = ppBVar4 + 1;
      pBVar10 = (Bond *)0x0;
      if (ppBVar4 !=
          (pMVar1->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
LAB_0015271c:
        pBVar10 = *ppBVar4;
      }
    }
    ppBVar5 = (pMVar1->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppBVar5 !=
        (pMVar1->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl
        .super__Vector_impl_data._M_finish) goto LAB_0015274d;
    pBVar11 = (Bend *)0x0;
    while (pBVar11 != (Bend *)0x0) {
      (this->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
      super__Vector_impl_data._M_start[(pBVar11->super_ShortRangeInteraction).globalIndex_] =
           pBVar11;
      ppBVar5 = ppBVar5 + 1;
      pBVar11 = (Bend *)0x0;
      if (ppBVar5 !=
          (pMVar1->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
LAB_0015274d:
        pBVar11 = *ppBVar5;
      }
    }
    ppTVar6 = (pMVar1->torsions_).
              super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (ppTVar6 !=
        (pMVar1->torsions_).
        super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_0015277e;
    pTVar12 = (Torsion *)0x0;
    while (pTVar12 != (Torsion *)0x0) {
      (this->torsions_).super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>.
      _M_impl.super__Vector_impl_data._M_start[(pTVar12->super_ShortRangeInteraction).globalIndex_]
           = pTVar12;
      ppTVar6 = ppTVar6 + 1;
      pTVar12 = (Torsion *)0x0;
      if (ppTVar6 !=
          (pMVar1->torsions_).
          super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
LAB_0015277e:
        pTVar12 = *ppTVar6;
      }
    }
    ppIVar7 = (pMVar1->inversions_).
              super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (ppIVar7 !=
        (pMVar1->inversions_).
        super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_001527ae;
    pIVar13 = (Inversion *)0x0;
    while (pIVar13 != (Inversion *)0x0) {
      (this->inversions_).
      super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
      super__Vector_impl_data._M_start[(pIVar13->super_ShortRangeInteraction).globalIndex_] =
           pIVar13;
      ppIVar7 = ppIVar7 + 1;
      pIVar13 = (Inversion *)0x0;
      if (ppIVar7 !=
          (pMVar1->inversions_).
          super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
LAB_001527ae:
        pIVar13 = *ppIVar7;
      }
    }
    pMVar1 = SimInfo::nextMolecule(this->info_,&local_60);
  }
  return;
}

Assistant:

SelectionManager::SelectionManager(SimInfo* info) : info_(info) {
    nObjects_.push_back(info_->getNGlobalAtoms() +
                        info_->getNGlobalRigidBodies());
    nObjects_.push_back(info_->getNGlobalBonds());
    nObjects_.push_back(info_->getNGlobalBends());
    nObjects_.push_back(info_->getNGlobalTorsions());
    nObjects_.push_back(info_->getNGlobalInversions());
    nObjects_.push_back(info_->getNGlobalMolecules());

    stuntdoubles_.resize(nObjects_[STUNTDOUBLE]);
    bonds_.resize(nObjects_[BOND]);
    bends_.resize(nObjects_[BEND]);
    torsions_.resize(nObjects_[TORSION]);
    inversions_.resize(nObjects_[INVERSION]);
    molecules_.resize(nObjects_[MOLECULE]);

    ss_.resize(nObjects_);

    SimInfo::MoleculeIterator mi;
    Molecule::AtomIterator ai;
    Molecule::RigidBodyIterator rbIter;
    Molecule::BondIterator bondIter;
    Molecule::BendIterator bendIter;
    Molecule::TorsionIterator torsionIter;
    Molecule::InversionIterator inversionIter;

    Molecule* mol;
    Atom* atom;
    RigidBody* rb;
    Bond* bond;
    Bend* bend;
    Torsion* torsion;
    Inversion* inversion;

    for (mol = info_->beginMolecule(mi); mol != NULL;
         mol = info_->nextMolecule(mi)) {
      molecules_[mol->getGlobalIndex()] = mol;

      for (atom = mol->beginAtom(ai); atom != NULL; atom = mol->nextAtom(ai)) {
        stuntdoubles_[atom->getGlobalIndex()] = atom;
      }
      for (rb = mol->beginRigidBody(rbIter); rb != NULL;
           rb = mol->nextRigidBody(rbIter)) {
        stuntdoubles_[rb->getGlobalIndex()] = rb;
      }
      for (bond = mol->beginBond(bondIter); bond != NULL;
           bond = mol->nextBond(bondIter)) {
        bonds_[bond->getGlobalIndex()] = bond;
      }
      for (bend = mol->beginBend(bendIter); bend != NULL;
           bend = mol->nextBend(bendIter)) {
        bends_[bend->getGlobalIndex()] = bend;
      }
      for (torsion = mol->beginTorsion(torsionIter); torsion != NULL;
           torsion = mol->nextTorsion(torsionIter)) {
        torsions_[torsion->getGlobalIndex()] = torsion;
      }
      for (inversion = mol->beginInversion(inversionIter); inversion != NULL;
           inversion = mol->nextInversion(inversionIter)) {
        inversions_[inversion->getGlobalIndex()] = inversion;
      }
    }
  }